

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O2

Abc_Cex_t * Abc_CexAllocFull(int nRegs,int nRealPis,int nFrames)

{
  size_t __size;
  Abc_Cex_t *__s;
  uint uVar1;
  
  uVar1 = nFrames * nRealPis + nRegs;
  __size = (long)(int)((((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0)) * 4 + 0x14;
  __s = (Abc_Cex_t *)malloc(__size);
  memset(__s,0xff,__size);
  __s->nRegs = nRegs;
  __s->nPis = nRealPis;
  __s->nBits = uVar1;
  return __s;
}

Assistant:

Abc_Cex_t * Abc_CexAllocFull( int nRegs, int nRealPis, int nFrames )
{
    Abc_Cex_t * pCex;
    int nWords = Abc_BitWordNum( nRegs + nRealPis * nFrames );
    pCex = (Abc_Cex_t *)ABC_ALLOC( char, sizeof(Abc_Cex_t) + sizeof(unsigned) * nWords );
    memset( pCex, 0xFF, sizeof(Abc_Cex_t) + sizeof(unsigned) * nWords );
    pCex->nRegs  = nRegs;
    pCex->nPis   = nRealPis;
    pCex->nBits  = nRegs + nRealPis * nFrames;
    return pCex;
}